

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O1

uint64_t kernel::GetBogoSize(CScript *script_pub_key)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  uVar1 = (script_pub_key->super_CScriptBase)._size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (ulong)(uVar2 + 0x32);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t GetBogoSize(const CScript& script_pub_key)
{
    return 32 /* txid */ +
           4 /* vout index */ +
           4 /* height + coinbase */ +
           8 /* amount */ +
           2 /* scriptPubKey len */ +
           script_pub_key.size() /* scriptPubKey */;
}